

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O0

WW<135UL> * __thiscall GF2::WW<135UL>::Permute(WW<135UL> *this,size_t *pi)

{
  bool bVar1;
  WW<135UL> *pWVar2;
  long in_RSI;
  WW<135UL> *in_RDI;
  size_t pos;
  WW<135UL> temp;
  ulong local_30;
  WW<135UL> local_28;
  long local_10;
  
  local_10 = in_RSI;
  WW((WW<135UL> *)0x17c772);
  for (local_30 = 0; local_30 < 0x87; local_30 = local_30 + 1) {
    if (*(long *)(local_10 + local_30 * 8) == -1) {
      bVar1 = false;
    }
    else {
      bVar1 = Test(in_RDI,*(size_t *)(local_10 + local_30 * 8));
    }
    Set(&local_28,local_30,bVar1 != false);
  }
  pWVar2 = operator=(in_RDI,&local_28);
  return pWVar2;
}

Assistant:

WW& Permute(const size_t pi[_n])
	{	
		WW<_n> temp;
		for (size_t pos = 0; pos < _n; ++pos)
			temp.Set(pos, pi[pos] == SIZE_MAX ? 0 : Test(pi[pos]));
		return operator=(temp);
	}